

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::Version::~Version(Version *this)

{
  long lVar1;
  value_type pFVar2;
  size_type sVar3;
  reference ppFVar4;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *pvVar5;
  long in_RDI;
  long in_FS_OFFSET;
  FileMetaData *f;
  size_t i;
  int level;
  FileMetaData *in_stack_ffffffffffffffa8;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *pvVar6;
  size_type in_stack_ffffffffffffffb0;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
  *in_stack_ffffffffffffffb8;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *this_00;
  ulong local_20;
  int local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RDI + 0x18) != 0) {
    __assert_fail("refs_ == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0x45,"leveldb::Version::~Version()");
  }
  *(undefined8 *)(*(long *)(in_RDI + 0x10) + 8) = *(undefined8 *)(in_RDI + 8);
  *(undefined8 *)(*(long *)(in_RDI + 8) + 0x10) = *(undefined8 *)(in_RDI + 0x10);
  for (local_14 = 0; local_14 < 7; local_14 = local_14 + 1) {
    for (local_20 = 0;
        sVar3 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                          ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)in_stack_ffffffffffffffa8), local_20 < sVar3; local_20 = local_20 + 1)
    {
      ppFVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[](in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      pFVar2 = *ppFVar4;
      if (pFVar2->refs < 1) {
        __assert_fail("f->refs > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                      ,0x4f,"leveldb::Version::~Version()");
      }
      pFVar2->refs = pFVar2->refs + -1;
      if ((pFVar2->refs < 1) && (pFVar2 != (value_type)0x0)) {
        FileMetaData::~FileMetaData(in_stack_ffffffffffffffa8);
        operator_delete(pFVar2,0x58);
      }
    }
  }
  pvVar5 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
           (in_RDI + 0x20);
  this_00 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
            (in_RDI + 200);
  do {
    pvVar6 = this_00 + -1;
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector(this_00)
    ;
    this_00 = pvVar6;
  } while (pvVar6 != pvVar5);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Version::~Version() {
  assert(refs_ == 0);

  // Remove from linked list
  prev_->next_ = next_;
  next_->prev_ = prev_;

  // Drop references to files
  for (int level = 0; level < config::kNumLevels; level++) {
    for (size_t i = 0; i < files_[level].size(); i++) {
      FileMetaData* f = files_[level][i];
      assert(f->refs > 0);
      f->refs--;
      if (f->refs <= 0) {
        delete f;
      }
    }
  }
}